

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2019.h
# Opt level: O0

void __thiscall Spaghetti<RemSP>::FirstScan(Spaghetti<RemSP> *this)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uchar *puVar9;
  uint *puVar10;
  int iVar11;
  int local_b4;
  int c_3;
  uint *img_labels_row_prev_prev_1;
  uint *img_labels_row_3;
  uchar *img_row_prev_prev_1;
  uchar *img_row_prev_1;
  uchar *img_row_3;
  int r_1;
  int c_2;
  uint *img_labels_row_prev_prev;
  uint *img_labels_row_2;
  uchar *img_row_fol_1;
  uchar *img_row_prev_prev;
  uchar *img_row_prev;
  uchar *img_row_2;
  int r;
  int c_1;
  uint *img_labels_row_1;
  uchar *img_row_fol;
  uchar *img_row_1;
  int c;
  uint *img_labels_row;
  uchar *img_row;
  int w;
  int h;
  Spaghetti<RemSP> *this_local;
  
  uVar7 = *(uint *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  uVar1 = *(uint *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  *(uint *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74 = uVar7 & 0xfffffffe;
  this->o_rows = (int)uVar7 % 2 == 1;
  this->e_cols = uVar1 & 0xfffffffe;
  this->o_cols = (int)uVar1 % 2 == 1;
  RemSP::Setup();
  if (uVar7 == 1) {
    puVar9 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,0);
    puVar10 = cv::Mat::ptr<unsigned_int>
                        (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                          super_Mat,0);
    img_row_1._4_4_ = -2;
LAB_00192494:
    iVar6 = img_row_1._4_4_ + 2;
    if (iVar6 < (int)(uVar1 - 2)) {
      if (puVar9[iVar6] == '\0') goto LAB_0019250f;
      if (puVar9[img_row_1._4_4_ + 3] == '\0') {
        uVar7 = RemSP::NewLabel();
        puVar10[iVar6] = uVar7;
        img_row_1._4_4_ = iVar6;
      }
      else {
        uVar7 = RemSP::NewLabel();
        puVar10[iVar6] = uVar7;
        img_row_1._4_4_ = iVar6;
        while( true ) {
          while( true ) {
            iVar6 = img_row_1._4_4_ + 2;
            if ((int)(uVar1 - 2) <= iVar6) {
              if ((int)(uVar1 - 2) < iVar6) {
                if (puVar9[iVar6] != '\0') {
                  puVar10[iVar6] = puVar10[img_row_1._4_4_];
                  return;
                }
                puVar10[iVar6] = 0;
                return;
              }
              if (puVar9[iVar6] != '\0') {
                if (puVar9[img_row_1._4_4_ + 3] != '\0') {
                  puVar10[iVar6] = puVar10[img_row_1._4_4_];
                  return;
                }
                puVar10[iVar6] = puVar10[img_row_1._4_4_];
                return;
              }
              goto LAB_001926ac;
            }
            if (puVar9[iVar6] == '\0') break;
            if (puVar9[img_row_1._4_4_ + 3] == '\0') {
              puVar10[iVar6] = puVar10[img_row_1._4_4_];
              img_row_1._4_4_ = iVar6;
              goto LAB_00192494;
            }
            puVar10[iVar6] = puVar10[img_row_1._4_4_];
            img_row_1._4_4_ = iVar6;
          }
LAB_0019250f:
          img_row_1._4_4_ = iVar6;
          if (puVar9[img_row_1._4_4_ + 1] == '\0') break;
          uVar7 = RemSP::NewLabel();
          puVar10[img_row_1._4_4_] = uVar7;
        }
        puVar10[img_row_1._4_4_] = 0;
      }
      goto LAB_00192494;
    }
    if ((int)(uVar1 - 2) < iVar6) {
      if (puVar9[iVar6] == '\0') {
        puVar10[iVar6] = 0;
      }
      else {
        uVar7 = RemSP::NewLabel();
        puVar10[iVar6] = uVar7;
      }
    }
    else if (puVar9[iVar6] == '\0') {
LAB_001926ac:
      img_row_1._4_4_ = iVar6;
      if (puVar9[img_row_1._4_4_ + 1] == '\0') {
        puVar10[img_row_1._4_4_] = 0;
      }
      else {
        uVar7 = RemSP::NewLabel();
        puVar10[img_row_1._4_4_] = uVar7;
      }
    }
    else if (puVar9[img_row_1._4_4_ + 3] == '\0') {
      uVar7 = RemSP::NewLabel();
      puVar10[iVar6] = uVar7;
    }
    else {
      uVar7 = RemSP::NewLabel();
      puVar10[iVar6] = uVar7;
    }
  }
  else {
    puVar9 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,0);
    lVar2 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
    puVar10 = cv::Mat::ptr<unsigned_int>
                        (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                          super_Mat,0);
    img_row_2._4_4_ = -2;
LAB_0019279f:
    img_row_2._4_4_ = img_row_2._4_4_ + 2;
    iVar6 = img_row_2._4_4_;
    if (img_row_2._4_4_ < (int)(uVar1 - 2)) {
      if ((puVar9[img_row_2._4_4_] == '\0') && (puVar9[img_row_2._4_4_ + lVar2] == '\0'))
      goto LAB_00192835;
LAB_001927dc:
      if (puVar9[img_row_2._4_4_ + 1] == '\0') {
        uVar8 = RemSP::NewLabel();
        puVar10[img_row_2._4_4_] = uVar8;
        goto LAB_00192942;
      }
      uVar8 = RemSP::NewLabel();
      puVar10[img_row_2._4_4_] = uVar8;
LAB_0019289d:
      do {
        iVar6 = img_row_2._4_4_ + 2;
        if ((int)(uVar1 - 2) <= iVar6) {
          if ((int)(uVar1 - 2) < iVar6) {
            if (puVar9[iVar6] == '\0') {
              if (puVar9[iVar6 + lVar2] == '\0') {
                puVar10[iVar6] = 0;
              }
              else {
                puVar10[iVar6] = puVar10[img_row_2._4_4_];
              }
            }
            else {
              puVar10[iVar6] = puVar10[img_row_2._4_4_];
            }
          }
          else {
            img_row_2._4_4_ = iVar6;
            if ((puVar9[iVar6] == '\0') && (puVar9[iVar6 + lVar2] == '\0')) goto LAB_00192c22;
LAB_00192ca3:
            if (puVar9[img_row_2._4_4_ + 1] == '\0') {
              puVar10[img_row_2._4_4_] = puVar10[img_row_2._4_4_ + -2];
            }
            else {
              puVar10[img_row_2._4_4_] = puVar10[img_row_2._4_4_ + -2];
            }
          }
          goto LAB_00192d74;
        }
        img_row_2._4_4_ = iVar6;
        if ((puVar9[iVar6] == '\0') && (puVar9[iVar6 + lVar2] == '\0')) {
LAB_00192835:
          img_row_2._4_4_ = iVar6;
          if (puVar9[img_row_2._4_4_ + 1] == '\0') {
            if (puVar9[(img_row_2._4_4_ + 1) + lVar2] == '\0') {
              puVar10[img_row_2._4_4_] = 0;
              goto LAB_0019279f;
            }
            uVar8 = RemSP::NewLabel();
            puVar10[img_row_2._4_4_] = uVar8;
          }
          else {
            uVar8 = RemSP::NewLabel();
            puVar10[img_row_2._4_4_] = uVar8;
          }
        }
        else {
          while (puVar9[img_row_2._4_4_ + 1] == '\0') {
            puVar10[img_row_2._4_4_] = puVar10[img_row_2._4_4_ + -2];
LAB_00192942:
            while( true ) {
              iVar6 = img_row_2._4_4_ + 2;
              if ((int)(uVar1 - 2) <= iVar6) {
                if ((int)(uVar1 - 2) < iVar6) {
                  if ((puVar9[iVar6] == '\0') && (puVar9[iVar6 + lVar2] == '\0')) {
                    puVar10[iVar6] = 0;
                    goto LAB_00192d74;
                  }
                }
                else {
                  if (puVar9[iVar6] != '\0') {
                    iVar11 = img_row_2._4_4_ + 1;
                    img_row_2._4_4_ = iVar6;
                    if (puVar9[iVar11 + lVar2] == '\0') goto LAB_00192bcf;
                    goto LAB_00192ca3;
                  }
                  if (puVar9[iVar6 + lVar2] == '\0') goto LAB_00192c22;
                }
                if (puVar9[(img_row_2._4_4_ + 1) + lVar2] == '\0') {
                  uVar8 = RemSP::NewLabel();
                  puVar10[iVar6] = uVar8;
                }
                else {
                  puVar10[iVar6] = puVar10[img_row_2._4_4_];
                }
                goto LAB_00192d74;
              }
              if (puVar9[iVar6] != '\0') break;
              if (puVar9[iVar6 + lVar2] == '\0') goto LAB_00192835;
              if (puVar9[img_row_2._4_4_ + 3] != '\0') {
                if (puVar9[(img_row_2._4_4_ + 1) + lVar2] == '\0') {
                  uVar8 = RemSP::NewLabel();
                  puVar10[iVar6] = uVar8;
                  img_row_2._4_4_ = iVar6;
                }
                else {
                  puVar10[iVar6] = puVar10[img_row_2._4_4_];
                  img_row_2._4_4_ = iVar6;
                }
                goto LAB_0019289d;
              }
              if (puVar9[(img_row_2._4_4_ + 1) + lVar2] == '\0') {
                uVar8 = RemSP::NewLabel();
                puVar10[iVar6] = uVar8;
                img_row_2._4_4_ = iVar6;
              }
              else {
                puVar10[iVar6] = puVar10[img_row_2._4_4_];
                img_row_2._4_4_ = iVar6;
              }
            }
            iVar11 = img_row_2._4_4_ + 1;
            img_row_2._4_4_ = iVar6;
            if (puVar9[iVar11 + lVar2] == '\0') goto LAB_001927dc;
          }
          puVar10[img_row_2._4_4_] = puVar10[img_row_2._4_4_ + -2];
        }
      } while( true );
    }
    if ((int)(uVar1 - 2) < img_row_2._4_4_) {
      if (puVar9[img_row_2._4_4_] == '\0') {
        if (puVar9[img_row_2._4_4_ + lVar2] == '\0') {
          puVar10[img_row_2._4_4_] = 0;
        }
        else {
          uVar8 = RemSP::NewLabel();
          puVar10[img_row_2._4_4_] = uVar8;
        }
      }
      else {
        uVar8 = RemSP::NewLabel();
        puVar10[img_row_2._4_4_] = uVar8;
      }
    }
    else if ((puVar9[img_row_2._4_4_] == '\0') && (puVar9[img_row_2._4_4_ + lVar2] == '\0')) {
LAB_00192c22:
      img_row_2._4_4_ = iVar6;
      if (puVar9[img_row_2._4_4_ + 1] == '\0') {
        if (puVar9[(img_row_2._4_4_ + 1) + lVar2] == '\0') {
          puVar10[img_row_2._4_4_] = 0;
        }
        else {
          uVar8 = RemSP::NewLabel();
          puVar10[img_row_2._4_4_] = uVar8;
        }
      }
      else {
        uVar8 = RemSP::NewLabel();
        puVar10[img_row_2._4_4_] = uVar8;
      }
    }
    else {
LAB_00192bcf:
      if (puVar9[img_row_2._4_4_ + 1] == '\0') {
        uVar8 = RemSP::NewLabel();
        puVar10[img_row_2._4_4_] = uVar8;
      }
      else {
        uVar8 = RemSP::NewLabel();
        puVar10[img_row_2._4_4_] = uVar8;
      }
    }
LAB_00192d74:
    for (img_row_2._0_4_ = 2;
        (int)img_row_2 < *(int *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74;
        img_row_2._0_4_ = (int)img_row_2 + 2) {
      puVar9 = cv::Mat::ptr<unsigned_char>
                         (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                          (int)img_row_2);
      lVar2 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
      lVar4 = -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48 -
              lVar2;
      lVar3 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
      puVar10 = cv::Mat::ptr<unsigned_int>
                          (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                            super_Mat,(int)img_row_2);
      lVar5 = -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                           field_0x48 -
              **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                          field_0x48;
      iVar6 = 0;
      img_row_3._4_4_ = 0;
      if (0 < (int)(uVar1 - 2)) {
        if (*puVar9 == '\0') goto LAB_00193003;
LAB_00192e79:
        img_row_3._4_4_ = iVar6;
        if (puVar9[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
          if (puVar9[img_row_3._4_4_ + 1] != '\0') goto LAB_00192ec6;
          if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
            uVar8 = RemSP::NewLabel();
            puVar10[img_row_3._4_4_] = uVar8;
            goto LAB_00194a96;
          }
          puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
          goto LAB_00194b5d;
        }
        puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
LAB_00194f8e:
        do {
          iVar6 = img_row_3._4_4_ + 2;
          if ((int)(uVar1 - 2) <= iVar6) {
            if ((int)(uVar1 - 2) < iVar6) {
              if (puVar9[iVar6] == '\0') {
                if (puVar9[iVar6 + lVar3] == '\0') {
                  puVar10[iVar6] = 0;
                }
                else {
LAB_00195b3d:
                  if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') {
                    if (puVar9[img_row_3._4_4_ + 1] == '\0') {
                      uVar8 = RemSP::NewLabel();
                      puVar10[iVar6] = uVar8;
                    }
                    else {
                      puVar10[iVar6] = puVar10[img_row_3._4_4_];
                    }
                  }
                  else {
                    puVar10[iVar6] = puVar10[img_row_3._4_4_];
                  }
                }
              }
              else if (puVar9[img_row_3._4_4_ + 1] == '\0') {
                if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') {
LAB_00195add:
                  if (puVar9[iVar6 - lVar2] == '\0') {
                    puVar10[iVar6] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
                  }
                  else {
                    puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
                  }
                }
                else {
                  puVar10[iVar6] = puVar10[img_row_3._4_4_];
                }
              }
              else {
                puVar10[iVar6] = puVar10[img_row_3._4_4_];
              }
              goto LAB_00196918;
            }
            if (puVar9[iVar6] == '\0') {
              if (puVar9[iVar6 + lVar3] == '\0') goto LAB_00195d13;
              if (puVar9[img_row_3._4_4_ + 3] == '\0') goto LAB_00195b3d;
              if (puVar9[img_row_3._4_4_ + 1] != '\0') goto LAB_0019635d;
              if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') goto LAB_00195c9a;
              if (puVar9[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                if (puVar9[iVar6 - lVar2] == '\0') {
                  puVar10[iVar6] = puVar10[img_row_3._4_4_];
                }
                else {
                  puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
                }
                goto LAB_00196918;
              }
            }
            else {
              if ((puVar9[img_row_3._4_4_ + 1] == '\0') &&
                 (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0')) {
                if (puVar9[(img_row_3._4_4_ + 3) - lVar2] == '\0') goto LAB_00195add;
                img_row_3._4_4_ = iVar6;
                if (puVar9[iVar6 - lVar2] == '\0') {
LAB_00195de9:
                  if (puVar9[img_row_3._4_4_ + lVar4] == '\0') {
                    uVar8 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                  (long)(img_row_3._4_4_ + -2) * 4 + lVar5),
                                         *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5
                                                  ));
                    puVar10[img_row_3._4_4_] = uVar8;
                  }
                  else {
                    puVar10[img_row_3._4_4_] =
                         *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
                  }
                }
                else {
                  puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
                }
                goto LAB_00196918;
              }
LAB_0019635d:
              img_row_3._4_4_ = iVar6;
              iVar6 = img_row_3._4_4_;
              if (puVar9[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
                puVar10[img_row_3._4_4_] = puVar10[img_row_3._4_4_ + -2];
                goto LAB_00196918;
              }
            }
LAB_00196379:
            img_row_3._4_4_ = iVar6;
            if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
              if (puVar9[img_row_3._4_4_ + lVar4] == '\0') {
                uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                                     puVar10[img_row_3._4_4_ + -2]);
                puVar10[img_row_3._4_4_] = uVar8;
              }
              else {
                puVar10[img_row_3._4_4_] =
                     *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
              }
            }
            else {
              puVar10[img_row_3._4_4_] =
                   *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
            }
            goto LAB_00196918;
          }
          if (puVar9[iVar6] == '\0') {
            if (puVar9[iVar6 + lVar3] == '\0') goto LAB_0019307b;
            if (puVar9[img_row_3._4_4_ + 3] == '\0') {
              if (puVar9[(img_row_3._4_4_ + 1) + lVar3] != '\0') {
                puVar10[iVar6] = puVar10[img_row_3._4_4_];
                img_row_3._4_4_ = iVar6;
                goto LAB_0019464d;
              }
              if (puVar9[img_row_3._4_4_ + 1] == '\0') {
                uVar8 = RemSP::NewLabel();
                puVar10[iVar6] = uVar8;
                img_row_3._4_4_ = iVar6;
                goto LAB_0019464d;
              }
              puVar10[iVar6] = puVar10[img_row_3._4_4_];
              img_row_3._4_4_ = iVar6;
              goto LAB_0019464d;
            }
            if (puVar9[img_row_3._4_4_ + 1] != '\0') goto LAB_00194580;
            if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') goto LAB_0019302c;
            if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') goto LAB_0019459c;
            if (puVar9[(img_row_3._4_4_ + 4) - lVar2] != '\0') goto LAB_00194423;
            if (puVar9[iVar6 - lVar2] != '\0') {
              puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
              img_row_3._4_4_ = iVar6;
              goto LAB_00193d1f;
            }
            puVar10[iVar6] = puVar10[img_row_3._4_4_];
            img_row_3._4_4_ = iVar6;
LAB_00193ac0:
            iVar6 = img_row_3._4_4_ + 2;
            if ((int)(uVar1 - 2) <= iVar6) {
              if ((int)(uVar1 - 2) < iVar6) {
LAB_00195883:
                img_row_3._4_4_ = iVar6;
                if (puVar9[img_row_3._4_4_] == '\0') {
LAB_0019583f:
                  if (puVar9[img_row_3._4_4_ + lVar3] == '\0') {
                    puVar10[img_row_3._4_4_] = 0;
                  }
                  else {
                    puVar10[img_row_3._4_4_] = puVar10[img_row_3._4_4_ + -2];
                  }
                }
                else {
                  puVar10[img_row_3._4_4_] = puVar10[img_row_3._4_4_ + -2];
                }
                goto LAB_00196918;
              }
              if (puVar9[iVar6] == '\0') {
                if (puVar9[iVar6 + lVar3] == '\0') {
LAB_00196120:
                  img_row_3._4_4_ = iVar6;
                  if (puVar9[img_row_3._4_4_ + 1] == '\0') goto LAB_00195d30;
                  if (puVar9[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
                    uVar8 = RemSP::NewLabel();
                    puVar10[img_row_3._4_4_] = uVar8;
                  }
                  else {
                    puVar10[img_row_3._4_4_] =
                         *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
                  }
                  goto LAB_00196918;
                }
                if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                  puVar10[iVar6] = puVar10[img_row_3._4_4_];
                  goto LAB_00196918;
                }
              }
              if (puVar9[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                puVar10[iVar6] = puVar10[img_row_3._4_4_];
              }
              else {
                uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                                     puVar10[img_row_3._4_4_]);
                puVar10[iVar6] = uVar8;
              }
              goto LAB_00196918;
            }
            if (puVar9[iVar6] == '\0') {
              if (puVar9[iVar6 + lVar3] == '\0') {
LAB_00193c86:
                img_row_3._4_4_ = iVar6;
                iVar6 = img_row_3._4_4_;
                if (puVar9[img_row_3._4_4_ + 1] == '\0') goto LAB_00193095;
                if (puVar9[(img_row_3._4_4_ + 1) - lVar2] != '\0') {
                  puVar10[img_row_3._4_4_] =
                       *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
                  goto LAB_00194304;
                }
                if (puVar9[(img_row_3._4_4_ + 2) - lVar2] != '\0') {
                  puVar10[img_row_3._4_4_] =
                       *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5);
LAB_001940b9:
                  iVar6 = img_row_3._4_4_ + 2;
                  if ((int)(uVar1 - 2) <= iVar6) {
                    if ((int)(uVar1 - 2) < iVar6) goto LAB_00195883;
                    if (puVar9[iVar6] == '\0') {
                      if (puVar9[iVar6 + lVar3] == '\0') {
                        iVar11 = img_row_3._4_4_ + 3;
                        img_row_3._4_4_ = iVar6;
                        if (puVar9[iVar11] == '\0') goto LAB_00195d30;
                        puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
                        goto LAB_00196918;
                      }
                      if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                        puVar10[iVar6] = puVar10[img_row_3._4_4_];
                        goto LAB_00196918;
                      }
                    }
                    if (puVar9[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                      puVar10[iVar6] = puVar10[img_row_3._4_4_];
                    }
                    else {
                      puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
                    }
                    goto LAB_00196918;
                  }
                  if (puVar9[iVar6] == '\0') {
                    if (puVar9[iVar6 + lVar3] == '\0') {
                      if (puVar9[img_row_3._4_4_ + 3] == '\0') goto LAB_00193095;
                      if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') {
                        puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
                        img_row_3._4_4_ = iVar6;
                        goto LAB_00194304;
                      }
                      iVar11 = img_row_3._4_4_ + 4;
                      img_row_3._4_4_ = iVar6;
                      if (puVar9[iVar11 - lVar2] == '\0') {
                        puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
                        goto LAB_00193d1f;
                      }
LAB_00192ef3:
                      if (puVar9[(img_row_3._4_4_ + 1) + lVar4] == '\0') {
                        uVar8 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                      (long)img_row_3._4_4_ * 4 + lVar5),
                                             *(uint *)((long)puVar10 +
                                                      (long)(img_row_3._4_4_ + 2) * 4 + lVar5));
                        puVar10[img_row_3._4_4_] = uVar8;
                      }
                      else {
                        puVar10[img_row_3._4_4_] =
                             *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5);
                      }
                      goto LAB_001940b9;
                    }
                    if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                      puVar10[iVar6] = puVar10[img_row_3._4_4_];
                      img_row_3._4_4_ = iVar6;
                      goto LAB_0019464d;
                    }
                    if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') {
                      puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
                      img_row_3._4_4_ = iVar6;
                      goto LAB_00194304;
                    }
                  }
                  else {
                    if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') {
                      puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
                      img_row_3._4_4_ = iVar6;
                      goto LAB_00194f8e;
                    }
                    if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                      puVar10[iVar6] = puVar10[img_row_3._4_4_];
                      img_row_3._4_4_ = iVar6;
                      goto LAB_0019529c;
                    }
                  }
                  if (puVar9[(img_row_3._4_4_ + 4) - lVar2] == '\0') {
                    puVar10[iVar6] = puVar10[img_row_3._4_4_];
                    img_row_3._4_4_ = iVar6;
LAB_00194749:
                    do {
                      iVar6 = img_row_3._4_4_ + 2;
                      if ((int)(uVar1 - 2) <= iVar6) {
                        if ((int)(uVar1 - 2) < iVar6) goto LAB_00195883;
                        if (puVar9[iVar6] == '\0') {
                          if (puVar9[iVar6 + lVar3] == '\0') goto LAB_00196120;
                          if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                            puVar10[iVar6] = puVar10[img_row_3._4_4_];
                            goto LAB_00196918;
                          }
                        }
                        if (puVar9[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                          puVar10[iVar6] = puVar10[img_row_3._4_4_];
                        }
                        else if (puVar9[iVar6 + lVar4] == '\0') {
                          uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                                               puVar10[img_row_3._4_4_]);
                          puVar10[iVar6] = uVar8;
                        }
                        else {
LAB_00195c0f:
                          img_row_3._4_4_ = iVar6;
                          iVar6 = img_row_3._4_4_;
                          if (puVar9[(img_row_3._4_4_ + -2) - lVar2] == '\0') {
                            uVar8 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                          (long)img_row_3._4_4_ * 4 + lVar5),
                                                 puVar10[img_row_3._4_4_ + -2]);
                            puVar10[img_row_3._4_4_] = uVar8;
                          }
                          else {
LAB_001959d5:
                            img_row_3._4_4_ = iVar6;
                            if (puVar9[(img_row_3._4_4_ + -1) + lVar4] == '\0') {
                              uVar8 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                            (long)img_row_3._4_4_ * 4 + lVar5),
                                                   puVar10[img_row_3._4_4_ + -2]);
                              puVar10[img_row_3._4_4_] = uVar8;
                            }
                            else {
                              puVar10[img_row_3._4_4_] =
                                   *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
                            }
                          }
                        }
                        goto LAB_00196918;
                      }
                      if (puVar9[iVar6] == '\0') {
                        if (puVar9[iVar6 + lVar3] == '\0') goto LAB_00193c86;
                        if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                          puVar10[iVar6] = puVar10[img_row_3._4_4_];
                          img_row_3._4_4_ = iVar6;
                          goto LAB_0019464d;
                        }
                        if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') {
                          if (puVar9[iVar6 + lVar4] == '\0') {
                            uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                                                 puVar10[img_row_3._4_4_]);
                            puVar10[iVar6] = uVar8;
                            img_row_3._4_4_ = iVar6;
                          }
                          else {
                            if (puVar9[img_row_3._4_4_ - lVar2] != '\0') goto LAB_00193ffa;
                            uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                                                 puVar10[img_row_3._4_4_]);
                            puVar10[iVar6] = uVar8;
                            img_row_3._4_4_ = iVar6;
                          }
LAB_00194304:
                          do {
                            iVar6 = img_row_3._4_4_ + 2;
                            if ((int)(uVar1 - 2) <= iVar6) {
                              if ((int)(uVar1 - 2) < iVar6) goto LAB_00195883;
                              if (puVar9[iVar6] != '\0') goto LAB_0019635d;
                              if (puVar9[iVar6 + lVar3] == '\0') goto LAB_00195d13;
                              if (puVar9[img_row_3._4_4_ + 3] != '\0') goto LAB_0019635d;
                              puVar10[iVar6] = puVar10[img_row_3._4_4_];
                              goto LAB_00196918;
                            }
                            if (puVar9[iVar6] != '\0') goto LAB_00194345;
                            if (puVar9[iVar6 + lVar3] == '\0') goto LAB_0019307b;
                            if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                              puVar10[iVar6] = puVar10[img_row_3._4_4_];
                              img_row_3._4_4_ = iVar6;
LAB_0019464d:
                              iVar6 = img_row_3._4_4_ + 2;
                              if (iVar6 < (int)(uVar1 - 2)) {
                                if (puVar9[iVar6] != '\0') {
                                  iVar11 = img_row_3._4_4_ + 1;
                                  img_row_3._4_4_ = iVar6;
                                  if (puVar9[iVar11 + lVar3] == '\0') goto LAB_00193112;
                                  goto LAB_0019345c;
                                }
LAB_001946aa:
                                img_row_3._4_4_ = iVar6;
                                iVar6 = img_row_3._4_4_;
                                if (puVar9[img_row_3._4_4_ + lVar3] == '\0') goto LAB_0019307b;
                                if (puVar9[img_row_3._4_4_ + 1] != '\0') {
                                  if (puVar9[(img_row_3._4_4_ + -1) + lVar3] == '\0')
                                  goto LAB_0019302c;
LAB_00193954:
                                  img_row_3._4_4_ = iVar6;
                                  if (puVar9[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
LAB_0019399e:
                                    if (puVar9[(img_row_3._4_4_ + 2) - lVar2] == '\0') {
LAB_0019380e:
                                      if (puVar9[img_row_3._4_4_ - lVar2] != '\0') {
                                        uVar8 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                                      (long)img_row_3._4_4_ * 4 +
                                                                      lVar5),
                                                             puVar10[img_row_3._4_4_ + -2]);
                                        puVar10[img_row_3._4_4_] = uVar8;
LAB_00193d1f:
                                        iVar6 = img_row_3._4_4_ + 2;
                                        if (iVar6 < (int)(uVar1 - 2)) {
                                          if (puVar9[iVar6] != '\0') {
                                            if (puVar9[(img_row_3._4_4_ + 3) - lVar2] == '\0')
                                            goto LAB_00193e20;
                                            if (puVar9[iVar6 + lVar4] != '\0') goto LAB_00193d8b;
                                            uVar8 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                                          (long)iVar6 * 4 + lVar5),
                                                                 puVar10[img_row_3._4_4_]);
                                            puVar10[iVar6] = uVar8;
                                            img_row_3._4_4_ = iVar6;
                                            goto LAB_00194f8e;
                                          }
                                          if (puVar9[iVar6 + lVar3] == '\0') goto LAB_00193c86;
                                          if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                            puVar10[iVar6] = puVar10[img_row_3._4_4_];
                                            img_row_3._4_4_ = iVar6;
                                            goto LAB_0019464d;
                                          }
                                          if (puVar9[(img_row_3._4_4_ + 3) - lVar2] == '\0')
                                          goto LAB_00193e3c;
                                          if (puVar9[iVar6 + lVar4] == '\0') {
                                            uVar8 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                                          (long)iVar6 * 4 + lVar5),
                                                                 puVar10[img_row_3._4_4_]);
                                            puVar10[iVar6] = uVar8;
                                            img_row_3._4_4_ = iVar6;
                                          }
                                          else {
LAB_00193ffa:
                                            img_row_3._4_4_ = iVar6;
                                            if (puVar9[(img_row_3._4_4_ + -1) + lVar4] == '\0') {
                                              uVar8 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                                            (long)img_row_3._4_4_ *
                                                                            4 + lVar5),
                                                                   puVar10[img_row_3._4_4_ + -2]);
                                              puVar10[img_row_3._4_4_] = uVar8;
                                            }
                                            else {
                                              puVar10[img_row_3._4_4_] =
                                                   *(uint *)((long)puVar10 +
                                                            (long)img_row_3._4_4_ * 4 + lVar5);
                                            }
                                          }
                                          goto LAB_00194304;
                                        }
                                        if ((int)(uVar1 - 2) < iVar6) goto LAB_00195883;
                                        if (puVar9[iVar6] == '\0') {
                                          if (puVar9[iVar6 + lVar3] == '\0') goto LAB_00196120;
                                          if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                            puVar10[iVar6] = puVar10[img_row_3._4_4_];
                                            goto LAB_00196918;
                                          }
                                        }
                                        if (puVar9[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                                          puVar10[iVar6] = puVar10[img_row_3._4_4_];
                                        }
                                        else {
                                          if (puVar9[iVar6 + lVar4] != '\0') goto LAB_001959d5;
                                          uVar8 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                                        (long)iVar6 * 4 + lVar5),
                                                               puVar10[img_row_3._4_4_]);
                                          puVar10[iVar6] = uVar8;
                                        }
                                        goto LAB_00196918;
                                      }
                                      puVar10[img_row_3._4_4_] = puVar10[img_row_3._4_4_ + -2];
                                      goto LAB_00193ac0;
                                    }
                                    if (puVar9[(img_row_3._4_4_ + 1) + lVar4] == '\0') {
                                      if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
                                        uVar8 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                                      (long)(img_row_3._4_4_ + 2) *
                                                                      4 + lVar5),
                                                             puVar10[img_row_3._4_4_ + -2]);
                                        puVar10[img_row_3._4_4_] = uVar8;
                                      }
                                      else {
                                        uVar8 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                                      (long)img_row_3._4_4_ * 4 +
                                                                      lVar5),
                                                             *(uint *)((long)puVar10 +
                                                                      (long)(img_row_3._4_4_ + 2) *
                                                                      4 + lVar5));
                                        uVar8 = RemSP::Merge(uVar8,puVar10[img_row_3._4_4_ + -2]);
                                        puVar10[img_row_3._4_4_] = uVar8;
                                      }
                                    }
                                    else {
                                      uVar8 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                                    (long)(img_row_3._4_4_ + 2) * 4
                                                                    + lVar5),
                                                           puVar10[img_row_3._4_4_ + -2]);
                                      puVar10[img_row_3._4_4_] = uVar8;
                                    }
                                    goto LAB_001940b9;
                                  }
                                  uVar8 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                                (long)img_row_3._4_4_ * 4 + lVar5),
                                                       puVar10[img_row_3._4_4_ + -2]);
                                  puVar10[img_row_3._4_4_] = uVar8;
                                  goto LAB_00194304;
                                }
LAB_001946f7:
                                img_row_3._4_4_ = iVar6;
                                if (puVar9[(img_row_3._4_4_ + -1) + lVar3] == '\0') {
                                  uVar8 = RemSP::NewLabel();
                                  puVar10[img_row_3._4_4_] = uVar8;
                                }
                                else {
                                  puVar10[img_row_3._4_4_] = puVar10[img_row_3._4_4_ + -2];
                                }
                                goto LAB_0019464d;
                              }
                              if ((int)(uVar1 - 2) < iVar6) {
                                if (puVar9[iVar6] == '\0') {
LAB_001958eb:
                                  img_row_3._4_4_ = iVar6;
                                  iVar6 = img_row_3._4_4_;
                                  if (puVar9[img_row_3._4_4_ + lVar3] == '\0') {
                                    puVar10[img_row_3._4_4_] = 0;
                                  }
                                  else {
LAB_001958fe:
                                    img_row_3._4_4_ = iVar6;
                                    if (puVar9[(img_row_3._4_4_ + -1) + lVar3] == '\0') {
                                      uVar8 = RemSP::NewLabel();
                                      puVar10[img_row_3._4_4_] = uVar8;
                                    }
                                    else {
                                      puVar10[img_row_3._4_4_] = puVar10[img_row_3._4_4_ + -2];
                                    }
                                  }
                                }
                                else {
                                  iVar11 = img_row_3._4_4_ + 1;
                                  img_row_3._4_4_ = iVar6;
                                  if (puVar9[iVar11 + lVar3] != '\0') goto LAB_00195792;
LAB_001956ff:
                                  if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
                                    if (puVar9[(img_row_3._4_4_ + -1) - lVar2] == '\0') {
                                      uVar8 = RemSP::NewLabel();
                                      puVar10[img_row_3._4_4_] = uVar8;
                                    }
                                    else {
                                      puVar10[img_row_3._4_4_] =
                                           *(uint *)((long)puVar10 +
                                                    (long)(img_row_3._4_4_ + -2) * 4 + lVar5);
                                    }
                                  }
                                  else {
                                    puVar10[img_row_3._4_4_] =
                                         *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5
                                                  );
                                  }
                                }
                                goto LAB_00196918;
                              }
                              if (puVar9[iVar6] == '\0') {
LAB_001964a1:
                                img_row_3._4_4_ = iVar6;
                                iVar6 = img_row_3._4_4_;
                                if (puVar9[img_row_3._4_4_ + lVar3] == '\0') goto LAB_00195d13;
                                if (puVar9[img_row_3._4_4_ + 1] == '\0') goto LAB_001958fe;
LAB_001964ca:
                                iVar6 = img_row_3._4_4_;
                                if (puVar9[(img_row_3._4_4_ + -1) + lVar3] == '\0')
                                goto LAB_00195c9a;
LAB_00195fe8:
                                img_row_3._4_4_ = iVar6;
                                if (puVar9[(img_row_3._4_4_ + 1) - lVar2] != '\0') {
                                  uVar8 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                                (long)img_row_3._4_4_ * 4 + lVar5),
                                                       puVar10[img_row_3._4_4_ + -2]);
                                  puVar10[img_row_3._4_4_] = uVar8;
                                  goto LAB_00196918;
                                }
                              }
                              else {
                                iVar11 = img_row_3._4_4_ + 1;
                                img_row_3._4_4_ = iVar6;
                                if (puVar9[iVar11 + lVar3] == '\0') {
LAB_00195d8b:
                                  if (puVar9[(img_row_3._4_4_ + 1) - lVar2] == '\0')
                                  goto LAB_001956ff;
                                  if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
                                    if (puVar9[(img_row_3._4_4_ + -1) - lVar2] != '\0')
                                    goto LAB_00195de9;
                                    puVar10[img_row_3._4_4_] =
                                         *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5
                                                  );
                                  }
                                  else {
                                    puVar10[img_row_3._4_4_] =
                                         *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5
                                                  );
                                  }
                                  goto LAB_00196918;
                                }
LAB_00195e83:
                                img_row_3._4_4_ = iVar6;
                                if (puVar9[(img_row_3._4_4_ + 1) - lVar2] != '\0') {
                                  if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
                                    if (puVar9[(img_row_3._4_4_ + -1) - lVar2] == '\0') {
                                      uVar8 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                                    (long)img_row_3._4_4_ * 4 +
                                                                    lVar5),
                                                           puVar10[img_row_3._4_4_ + -2]);
                                      puVar10[img_row_3._4_4_] = uVar8;
                                    }
                                    else if (puVar9[img_row_3._4_4_ + lVar4] == '\0') {
                                      uVar8 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                                    (long)(img_row_3._4_4_ + -2) * 4
                                                                    + lVar5),
                                                           *(uint *)((long)puVar10 +
                                                                    (long)img_row_3._4_4_ * 4 +
                                                                    lVar5));
                                      uVar8 = RemSP::Merge(uVar8,puVar10[img_row_3._4_4_ + -2]);
                                      puVar10[img_row_3._4_4_] = uVar8;
                                    }
                                    else {
                                      uVar8 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                                    (long)img_row_3._4_4_ * 4 +
                                                                    lVar5),
                                                           puVar10[img_row_3._4_4_ + -2]);
                                      puVar10[img_row_3._4_4_] = uVar8;
                                    }
                                  }
                                  else {
                                    uVar8 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                                  (long)img_row_3._4_4_ * 4 + lVar5)
                                                         ,puVar10[img_row_3._4_4_ + -2]);
                                    puVar10[img_row_3._4_4_] = uVar8;
                                  }
                                  goto LAB_00196918;
                                }
LAB_00195792:
                                if (puVar9[(img_row_3._4_4_ + -1) - lVar2] != '\0') {
                                  uVar8 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                                (long)(img_row_3._4_4_ + -2) * 4 +
                                                                lVar5),puVar10[img_row_3._4_4_ + -2]
                                                      );
                                  puVar10[img_row_3._4_4_] = uVar8;
                                  goto LAB_00196918;
                                }
                              }
LAB_001957de:
                              if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
                                puVar10[img_row_3._4_4_] = puVar10[img_row_3._4_4_ + -2];
                              }
                              else {
                                uVar8 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                              (long)img_row_3._4_4_ * 4 + lVar5),
                                                     puVar10[img_row_3._4_4_ + -2]);
                                puVar10[img_row_3._4_4_] = uVar8;
                              }
                              goto LAB_00196918;
                            }
LAB_00194580:
                            img_row_3._4_4_ = iVar6;
                            iVar6 = img_row_3._4_4_;
                            if (puVar9[(img_row_3._4_4_ + 1) - lVar2] == '\0') goto LAB_00194407;
LAB_0019459c:
                            img_row_3._4_4_ = iVar6;
                            if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
                              if (puVar9[img_row_3._4_4_ + lVar4] == '\0') {
                                uVar8 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                              (long)img_row_3._4_4_ * 4 + lVar5),
                                                     puVar10[img_row_3._4_4_ + -2]);
                                puVar10[img_row_3._4_4_] = uVar8;
                              }
                              else {
                                puVar10[img_row_3._4_4_] =
                                     *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
                              }
                            }
                            else {
                              puVar10[img_row_3._4_4_] =
                                   *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
                            }
                          } while( true );
                        }
                      }
                      else {
                        if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') {
                          if (puVar9[iVar6 + lVar4] == '\0') {
                            uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                                                 puVar10[img_row_3._4_4_]);
                            puVar10[iVar6] = uVar8;
                            img_row_3._4_4_ = iVar6;
                          }
                          else if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
                            uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                                                 puVar10[img_row_3._4_4_]);
                            puVar10[iVar6] = uVar8;
                            img_row_3._4_4_ = iVar6;
                          }
                          else {
LAB_00193d8b:
                            img_row_3._4_4_ = iVar6;
                            if (puVar9[(img_row_3._4_4_ + -1) + lVar4] == '\0') {
                              uVar8 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                            (long)img_row_3._4_4_ * 4 + lVar5),
                                                   puVar10[img_row_3._4_4_ + -2]);
                              puVar10[img_row_3._4_4_] = uVar8;
                            }
                            else {
                              puVar10[img_row_3._4_4_] =
                                   *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
                            }
                          }
                          goto LAB_00194f8e;
                        }
                        if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                          puVar10[iVar6] = puVar10[img_row_3._4_4_];
                          img_row_3._4_4_ = iVar6;
                          goto LAB_0019529c;
                        }
                      }
                      if (puVar9[(img_row_3._4_4_ + 4) - lVar2] != '\0') {
                        if (puVar9[(img_row_3._4_4_ + 3) + lVar4] == '\0') {
                          uVar8 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                        (long)(img_row_3._4_4_ + 4) * 4 + lVar5),
                                               puVar10[img_row_3._4_4_]);
                          puVar10[iVar6] = uVar8;
                          img_row_3._4_4_ = iVar6;
                        }
                        else if (puVar9[iVar6 + lVar4] == '\0') {
                          uVar8 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                        (long)(img_row_3._4_4_ + 4) * 4 + lVar5),
                                               puVar10[img_row_3._4_4_]);
                          puVar10[iVar6] = uVar8;
                          img_row_3._4_4_ = iVar6;
                        }
                        else if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
                          uVar8 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                        (long)(img_row_3._4_4_ + 4) * 4 + lVar5),
                                               puVar10[img_row_3._4_4_]);
                          puVar10[iVar6] = uVar8;
                          img_row_3._4_4_ = iVar6;
                        }
                        else {
LAB_00193e83:
                          img_row_3._4_4_ = iVar6;
                          if (puVar9[(img_row_3._4_4_ + -1) + lVar4] == '\0') {
                            uVar8 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                          (long)(img_row_3._4_4_ + 2) * 4 + lVar5),
                                                 puVar10[img_row_3._4_4_ + -2]);
                            puVar10[img_row_3._4_4_] = uVar8;
                          }
                          else {
                            puVar10[img_row_3._4_4_] =
                                 *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5);
                          }
                        }
                        goto LAB_001940b9;
                      }
                      puVar10[iVar6] = puVar10[img_row_3._4_4_];
                      img_row_3._4_4_ = iVar6;
                    } while( true );
                  }
                  if (puVar9[(img_row_3._4_4_ + 3) + lVar4] == '\0') {
                    uVar8 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                  (long)(img_row_3._4_4_ + 4) * 4 + lVar5),
                                         puVar10[img_row_3._4_4_]);
                    puVar10[iVar6] = uVar8;
                    img_row_3._4_4_ = iVar6;
                  }
                  else {
                    puVar10[iVar6] =
                         *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 4) * 4 + lVar5);
                    img_row_3._4_4_ = iVar6;
                  }
                  goto LAB_001940b9;
                }
                uVar8 = RemSP::NewLabel();
                puVar10[img_row_3._4_4_] = uVar8;
                goto LAB_00193ac0;
              }
              if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                puVar10[iVar6] = puVar10[img_row_3._4_4_];
                img_row_3._4_4_ = iVar6;
                goto LAB_0019464d;
              }
              if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') {
                uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                                     puVar10[img_row_3._4_4_]);
                puVar10[iVar6] = uVar8;
                img_row_3._4_4_ = iVar6;
                goto LAB_00194304;
              }
            }
            else {
              if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') {
                uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                                     puVar10[img_row_3._4_4_]);
                puVar10[iVar6] = uVar8;
                img_row_3._4_4_ = iVar6;
                goto LAB_00194f8e;
              }
              if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                puVar10[iVar6] = puVar10[img_row_3._4_4_];
                img_row_3._4_4_ = iVar6;
                goto LAB_0019529c;
              }
            }
            if (puVar9[(img_row_3._4_4_ + 4) - lVar2] == '\0') {
              puVar10[iVar6] = puVar10[img_row_3._4_4_];
              img_row_3._4_4_ = iVar6;
              goto LAB_00194749;
            }
            uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 4) * 4 + lVar5),
                                 puVar10[img_row_3._4_4_]);
            puVar10[iVar6] = uVar8;
            img_row_3._4_4_ = iVar6;
            goto LAB_001940b9;
          }
          if (puVar9[img_row_3._4_4_ + 1] != '\0') goto LAB_00194345;
          if (puVar9[(img_row_3._4_4_ + 1) + lVar3] != '\0') goto LAB_00194345;
          if (puVar9[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
            if (puVar9[img_row_3._4_4_ + 3] == '\0') {
              if (puVar9[iVar6 - lVar2] == '\0') {
                puVar10[iVar6] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
                img_row_3._4_4_ = iVar6;
                goto LAB_00194a96;
              }
              puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
              img_row_3._4_4_ = iVar6;
              goto LAB_00194b5d;
            }
            if (puVar9[(img_row_3._4_4_ + 4) - lVar2] != '\0') {
              img_row_3._4_4_ = iVar6;
              if (puVar9[iVar6 - lVar2] != '\0') goto LAB_00192ef3;
              goto LAB_0019324f;
            }
            if (puVar9[iVar6 - lVar2] != '\0') {
              puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
              img_row_3._4_4_ = iVar6;
              goto LAB_00193d1f;
            }
            puVar10[iVar6] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
            img_row_3._4_4_ = iVar6;
            goto LAB_00193ac0;
          }
          img_row_3._4_4_ = iVar6;
          if (puVar9[iVar6 - lVar2] == '\0') {
LAB_00193170:
            if (puVar9[img_row_3._4_4_ + lVar4] == '\0') {
              uVar8 = RemSP::Merge(*(uint *)((long)puVar10 +
                                            (long)(img_row_3._4_4_ + -2) * 4 + lVar5),
                                   *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5));
              puVar10[img_row_3._4_4_] = uVar8;
            }
            else {
              puVar10[img_row_3._4_4_] =
                   *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
            }
          }
          else {
            puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5);
          }
        } while( true );
      }
      img_row_3._4_4_ = iVar6;
      if ((int)(uVar1 - 2) < 0) {
        if (*puVar9 == '\0') {
LAB_001956b1:
          if (puVar9[img_row_3._4_4_ + lVar3] == '\0') {
            puVar10[img_row_3._4_4_] = 0;
          }
          else {
            uVar8 = RemSP::NewLabel();
            puVar10[img_row_3._4_4_] = uVar8;
          }
          goto LAB_00196918;
        }
LAB_00195672:
        img_row_3._4_4_ = iVar6;
        if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
          uVar8 = RemSP::NewLabel();
          puVar10[img_row_3._4_4_] = uVar8;
        }
        else {
          puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
        }
      }
      else if (*puVar9 == '\0') {
LAB_00195cd4:
        iVar6 = img_row_3._4_4_;
        if (puVar9[img_row_3._4_4_ + lVar3] == '\0') {
LAB_00195d13:
          img_row_3._4_4_ = iVar6;
          iVar6 = img_row_3._4_4_;
          if (puVar9[img_row_3._4_4_ + 1] != '\0') goto LAB_00195c9a;
LAB_00195d30:
          if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') {
            puVar10[img_row_3._4_4_] = 0;
          }
          else {
            uVar8 = RemSP::NewLabel();
            puVar10[img_row_3._4_4_] = uVar8;
          }
        }
        else {
          if (puVar9[img_row_3._4_4_ + 1] != '\0') goto LAB_00195c9a;
          uVar8 = RemSP::NewLabel();
          puVar10[img_row_3._4_4_] = uVar8;
        }
      }
      else {
LAB_00195c9a:
        img_row_3._4_4_ = iVar6;
        iVar6 = img_row_3._4_4_;
        if (puVar9[(img_row_3._4_4_ + 1) - lVar2] == '\0') goto LAB_00195672;
        puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
      }
LAB_00196918:
    }
    if ((this->o_rows & 1U) != 0) {
      puVar9 = cv::Mat::ptr<unsigned_char>
                         (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                          uVar7 - 1);
      lVar2 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
      lVar3 = -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48 -
              lVar2;
      puVar10 = cv::Mat::ptr<unsigned_int>
                          (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                            super_Mat,uVar7 - 1);
      lVar4 = -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                           field_0x48 -
              **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                          field_0x48;
      local_b4 = -2;
LAB_001969f2:
      iVar6 = local_b4 + 2;
      if (iVar6 < (int)(uVar1 - 2)) {
        if (puVar9[iVar6] == '\0') goto LAB_00196c52;
        if (puVar9[(local_b4 + 3) - lVar2] != '\0') {
          puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
          local_b4 = iVar6;
          goto LAB_00197c6c;
        }
        iVar11 = local_b4 + 3;
        local_b4 = iVar6;
        if (puVar9[iVar11] == '\0') {
          if (puVar9[iVar6 - lVar2] == '\0') {
            uVar7 = RemSP::NewLabel();
            puVar10[iVar6] = uVar7;
          }
          else {
            puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
          }
        }
        else {
LAB_00196aa5:
          if (puVar9[(local_b4 + 2) - lVar2] != '\0') {
            iVar6 = local_b4;
            if (puVar9[local_b4 - lVar2] != '\0') goto LAB_00196ae2;
            puVar10[local_b4] = *(uint *)((long)puVar10 + (long)(local_b4 + 2) * 4 + lVar4);
            goto LAB_001976eb;
          }
          if (puVar9[local_b4 - lVar2] == '\0') {
            uVar7 = RemSP::NewLabel();
            puVar10[local_b4] = uVar7;
            goto LAB_0019712c;
          }
          puVar10[local_b4] = *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
LAB_0019739b:
          iVar6 = local_b4 + 2;
          if ((int)(uVar1 - 2) <= iVar6) {
            if (iVar6 <= (int)(uVar1 - 2)) {
              if (puVar9[iVar6] == '\0') {
LAB_00198691:
                local_b4 = iVar6;
                if (puVar9[local_b4 + 1] == '\0') {
                  puVar10[local_b4] = 0;
                  return;
                }
                if (puVar9[(local_b4 + 1) - lVar2] != '\0') {
                  puVar10[local_b4] = *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                  return;
                }
                uVar7 = RemSP::NewLabel();
                puVar10[local_b4] = uVar7;
                return;
              }
              if (puVar9[(local_b4 + 3) - lVar2] == '\0') {
                puVar10[iVar6] = puVar10[local_b4];
                return;
              }
              if (puVar9[iVar6 + lVar3] == '\0') {
                uVar7 = RemSP::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4),
                                     puVar10[local_b4]);
                puVar10[iVar6] = uVar7;
                return;
              }
LAB_0019877b:
              local_b4 = iVar6;
              if (puVar9[(local_b4 + -1) + lVar3] != '\0') {
                puVar10[local_b4] = *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                return;
              }
              uVar7 = RemSP::Merge(*(uint *)((long)puVar10 + (long)(local_b4 + -2) * 4 + lVar4),
                                   *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4));
              puVar10[local_b4] = uVar7;
              return;
            }
LAB_001982c9:
            local_b4 = iVar6;
            if (puVar9[local_b4] != '\0') {
              puVar10[local_b4] = puVar10[local_b4 + -2];
              return;
            }
            puVar10[local_b4] = 0;
            return;
          }
          if (puVar9[iVar6] == '\0') goto LAB_001972b9;
          if (puVar9[(local_b4 + 3) - lVar2] != '\0') {
            if (puVar9[iVar6 + lVar3] != '\0') goto LAB_00197426;
            uVar7 = RemSP::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4),
                                 puVar10[local_b4]);
            puVar10[iVar6] = uVar7;
            local_b4 = iVar6;
            goto LAB_00197c6c;
          }
          if (puVar9[local_b4 + 3] != '\0') {
            if (puVar9[(local_b4 + 4) - lVar2] == '\0') {
              puVar10[iVar6] = puVar10[local_b4];
              local_b4 = iVar6;
              goto LAB_00197e70;
            }
            if (puVar9[(local_b4 + 3) + lVar3] == '\0') {
              uVar7 = RemSP::Merge(*(uint *)((long)puVar10 + (long)(local_b4 + 4) * 4 + lVar4),
                                   puVar10[local_b4]);
              puVar10[iVar6] = uVar7;
              local_b4 = iVar6;
              goto LAB_001976eb;
            }
            if (puVar9[iVar6 + lVar3] == '\0') {
              uVar7 = RemSP::Merge(*(uint *)((long)puVar10 + (long)(local_b4 + 4) * 4 + lVar4),
                                   puVar10[local_b4]);
              puVar10[iVar6] = uVar7;
              local_b4 = iVar6;
              goto LAB_001976eb;
            }
LAB_0019756e:
            local_b4 = iVar6;
            if (puVar9[(local_b4 + -1) + lVar3] == '\0') {
              uVar7 = RemSP::Merge(*(uint *)((long)puVar10 + (long)(local_b4 + 2) * 4 + lVar4),
                                   puVar10[local_b4 + -2]);
              puVar10[local_b4] = uVar7;
            }
            else {
              puVar10[local_b4] = *(uint *)((long)puVar10 + (long)(local_b4 + 2) * 4 + lVar4);
            }
LAB_001976eb:
            do {
              iVar6 = local_b4 + 2;
              if ((int)(uVar1 - 2) <= iVar6) {
                if (iVar6 <= (int)(uVar1 - 2)) {
                  if (puVar9[iVar6] == '\0') {
                    if (puVar9[local_b4 + 3] != '\0') {
                      puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                      return;
                    }
                    puVar10[iVar6] = 0;
                    return;
                  }
                  if (puVar9[(local_b4 + 3) - lVar2] != '\0') {
                    puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                    return;
                  }
                  puVar10[iVar6] = puVar10[local_b4];
                  return;
                }
                goto LAB_001982c9;
              }
              if (puVar9[iVar6] != '\0') {
                if (puVar9[(local_b4 + 3) - lVar2] != '\0') {
                  puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                  local_b4 = iVar6;
                  goto LAB_00197c6c;
                }
                if (puVar9[local_b4 + 3] == '\0') {
                  puVar10[iVar6] = puVar10[local_b4];
                  local_b4 = iVar6;
                  goto LAB_001969f2;
                }
                if (puVar9[(local_b4 + 4) - lVar2] == '\0') {
                  puVar10[iVar6] = puVar10[local_b4];
                  local_b4 = iVar6;
LAB_00197e70:
                  do {
                    iVar6 = local_b4 + 2;
                    if ((int)(uVar1 - 2) <= iVar6) {
                      if ((int)(uVar1 - 2) < iVar6) goto LAB_001982c9;
                      if (puVar9[iVar6] == '\0') goto LAB_00198691;
                      if (puVar9[(local_b4 + 3) - lVar2] == '\0') {
                        puVar10[iVar6] = puVar10[local_b4];
                        return;
                      }
                      if (puVar9[iVar6 + lVar3] == '\0') {
                        uVar7 = RemSP::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4),
                                             puVar10[local_b4]);
                        puVar10[iVar6] = uVar7;
                        return;
                      }
                      if (puVar9[local_b4 - lVar2] == '\0') {
                        uVar7 = RemSP::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4),
                                             puVar10[local_b4]);
                        puVar10[iVar6] = uVar7;
                        return;
                      }
                      goto LAB_0019877b;
                    }
                    if (puVar9[iVar6] == '\0') goto LAB_001972b9;
                    if (puVar9[(local_b4 + 3) - lVar2] == '\0') {
                      if (puVar9[local_b4 + 3] == '\0') {
                        puVar10[iVar6] = puVar10[local_b4];
                        local_b4 = iVar6;
                        goto LAB_001969f2;
                      }
                      if (puVar9[(local_b4 + 4) - lVar2] != '\0') {
                        if (puVar9[(local_b4 + 3) + lVar3] == '\0') {
                          uVar7 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                        (long)(local_b4 + 4) * 4 + lVar4),
                                               puVar10[local_b4]);
                          puVar10[iVar6] = uVar7;
                          local_b4 = iVar6;
                          goto LAB_001976eb;
                        }
                        if (puVar9[iVar6 + lVar3] == '\0') {
                          uVar7 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                        (long)(local_b4 + 4) * 4 + lVar4),
                                               puVar10[local_b4]);
                          puVar10[iVar6] = uVar7;
                          local_b4 = iVar6;
                        }
                        else {
                          if (puVar9[local_b4 - lVar2] != '\0') goto LAB_0019756e;
                          uVar7 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                        (long)(local_b4 + 4) * 4 + lVar4),
                                               puVar10[local_b4]);
                          puVar10[iVar6] = uVar7;
                          local_b4 = iVar6;
                        }
                        goto LAB_001976eb;
                      }
                      puVar10[iVar6] = puVar10[local_b4];
                      local_b4 = iVar6;
                    }
                    else {
                      if (puVar9[iVar6 + lVar3] == '\0') {
                        uVar7 = RemSP::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4),
                                             puVar10[local_b4]);
                        puVar10[iVar6] = uVar7;
                        local_b4 = iVar6;
                      }
                      else if (puVar9[local_b4 - lVar2] == '\0') {
                        uVar7 = RemSP::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4),
                                             puVar10[local_b4]);
                        puVar10[iVar6] = uVar7;
                        local_b4 = iVar6;
                      }
                      else {
LAB_00197426:
                        local_b4 = iVar6;
                        if (puVar9[(local_b4 + -1) + lVar3] == '\0') {
                          uVar7 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                        (long)(local_b4 + -2) * 4 + lVar4),
                                               *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4)
                                              );
                          puVar10[local_b4] = uVar7;
                        }
                        else {
                          puVar10[local_b4] = *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                        }
                      }
LAB_00197c6c:
                      iVar6 = local_b4 + 2;
                      if ((int)(uVar1 - 2) <= iVar6) {
                        if ((int)(uVar1 - 2) < iVar6) {
                          if (puVar9[iVar6] == '\0') {
                            puVar10[iVar6] = 0;
                            return;
                          }
                          if (puVar9[local_b4 + 1] != '\0') {
                            puVar10[iVar6] = puVar10[local_b4];
                            return;
                          }
                        }
                        else {
                          if (puVar9[iVar6] == '\0') goto LAB_00198467;
                          if (puVar9[local_b4 + 1] != '\0') {
LAB_00198969:
                            local_b4 = iVar6;
                            if (puVar9[(local_b4 + 1) - lVar2] == '\0') {
                              puVar10[local_b4] = puVar10[local_b4 + -2];
                              return;
                            }
                            if (puVar9[local_b4 - lVar2] != '\0') {
                              puVar10[local_b4] =
                                   *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                              return;
                            }
                            if (puVar9[local_b4 + lVar3] != '\0') {
                              puVar10[local_b4] =
                                   *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                              return;
                            }
                            uVar7 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                          (long)local_b4 * 4 + lVar4),
                                                 puVar10[local_b4 + -2]);
                            puVar10[local_b4] = uVar7;
                            return;
                          }
                          if (puVar9[(local_b4 + 3) - lVar2] != '\0') {
                            local_b4 = iVar6;
                            if (puVar9[iVar6 - lVar2] != '\0') {
                              puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                              return;
                            }
LAB_00198538:
                            if (puVar9[local_b4 + lVar3] != '\0') {
                              puVar10[local_b4] =
                                   *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                              return;
                            }
                            uVar7 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                          (long)(local_b4 + -2) * 4 + lVar4),
                                                 *(uint *)((long)puVar10 +
                                                          (long)local_b4 * 4 + lVar4));
                            puVar10[local_b4] = uVar7;
                            return;
                          }
                        }
                        if (puVar9[iVar6 - lVar2] != '\0') {
                          puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                          return;
                        }
                        puVar10[iVar6] = *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                        return;
                      }
                      if (puVar9[iVar6] == '\0') goto LAB_00196c52;
                      if (puVar9[local_b4 + 1] != '\0') {
LAB_001979b7:
                        local_b4 = iVar6;
                        if (puVar9[(local_b4 + 1) - lVar2] == '\0') {
                          if (puVar9[local_b4 + 1] == '\0') {
                            puVar10[local_b4] = puVar10[local_b4 + -2];
                            goto LAB_001969f2;
                          }
                          if (puVar9[(local_b4 + 2) - lVar2] == '\0') {
                            puVar10[local_b4] = puVar10[local_b4 + -2];
                            goto LAB_00197e70;
                          }
                          if (puVar9[(local_b4 + 1) + lVar3] == '\0') {
                            uVar7 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                          (long)(local_b4 + 2) * 4 + lVar4),
                                                 puVar10[local_b4 + -2]);
                            puVar10[local_b4] = uVar7;
                          }
                          else if (puVar9[local_b4 - lVar2] == '\0') {
                            if (puVar9[local_b4 + lVar3] == '\0') {
                              uVar7 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                            (long)(local_b4 + 2) * 4 + lVar4),
                                                   puVar10[local_b4 + -2]);
                              puVar10[local_b4] = uVar7;
                            }
                            else {
                              puVar10[local_b4] =
                                   *(uint *)((long)puVar10 + (long)(local_b4 + 2) * 4 + lVar4);
                            }
                          }
                          else {
                            puVar10[local_b4] =
                                 *(uint *)((long)puVar10 + (long)(local_b4 + 2) * 4 + lVar4);
                          }
                          goto LAB_001976eb;
                        }
                        if (puVar9[local_b4 - lVar2] == '\0') {
                          if (puVar9[local_b4 + lVar3] == '\0') {
                            uVar7 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                          (long)local_b4 * 4 + lVar4),
                                                 puVar10[local_b4 + -2]);
                            puVar10[local_b4] = uVar7;
                          }
                          else {
                            puVar10[local_b4] =
                                 *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                          }
                        }
                        else {
                          puVar10[local_b4] = *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                        }
                        goto LAB_00197c6c;
                      }
                      if (puVar9[(local_b4 + 3) - lVar2] != '\0') {
                        local_b4 = iVar6;
                        if (puVar9[iVar6 - lVar2] == '\0') {
LAB_00196d99:
                          if (puVar9[local_b4 + lVar3] == '\0') {
                            uVar7 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                          (long)(local_b4 + -2) * 4 + lVar4),
                                                 *(uint *)((long)puVar10 +
                                                          (long)local_b4 * 4 + lVar4));
                            puVar10[local_b4] = uVar7;
                          }
                          else {
                            puVar10[local_b4] =
                                 *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                          }
                        }
                        else {
                          puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                        }
                        goto LAB_00197c6c;
                      }
                      if (puVar9[local_b4 + 3] == '\0') {
                        if (puVar9[iVar6 - lVar2] == '\0') {
                          puVar10[iVar6] = *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                          local_b4 = iVar6;
                        }
                        else {
                          puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                          local_b4 = iVar6;
                        }
                        goto LAB_001969f2;
                      }
                      if (puVar9[(local_b4 + 4) - lVar2] != '\0') {
                        if (puVar9[iVar6 - lVar2] != '\0') goto LAB_00196ae2;
LAB_00196ec0:
                        local_b4 = iVar6;
                        if (puVar9[(local_b4 + 1) + lVar3] == '\0') {
                          uVar7 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                        (long)(local_b4 + -2) * 4 + lVar4),
                                               *(uint *)((long)puVar10 +
                                                        (long)(local_b4 + 2) * 4 + lVar4));
                          puVar10[local_b4] = uVar7;
                        }
                        else if (puVar9[local_b4 + lVar3] == '\0') {
                          uVar7 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                        (long)(local_b4 + -2) * 4 + lVar4),
                                               *(uint *)((long)puVar10 +
                                                        (long)(local_b4 + 2) * 4 + lVar4));
                          puVar10[local_b4] = uVar7;
                        }
                        else {
                          puVar10[local_b4] =
                               *(uint *)((long)puVar10 + (long)(local_b4 + 2) * 4 + lVar4);
                        }
                        goto LAB_001976eb;
                      }
                      if (puVar9[iVar6 - lVar2] != '\0') {
                        puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                        local_b4 = iVar6;
                        goto LAB_0019739b;
                      }
                      puVar10[iVar6] = *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                      local_b4 = iVar6;
LAB_0019712c:
                      iVar6 = local_b4 + 2;
                      if ((int)(uVar1 - 2) <= iVar6) {
                        if ((int)(uVar1 - 2) < iVar6) goto LAB_001982c9;
                        if (puVar9[iVar6] != '\0') {
                          if (puVar9[(local_b4 + 3) - lVar2] != '\0') {
                            uVar7 = RemSP::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4),
                                                 puVar10[local_b4]);
                            puVar10[iVar6] = uVar7;
                            return;
                          }
                          puVar10[iVar6] = puVar10[local_b4];
                          return;
                        }
                        goto LAB_00198691;
                      }
                      if (puVar9[iVar6] == '\0') {
LAB_001972b9:
                        local_b4 = iVar6;
                        if (puVar9[local_b4 + 1] == '\0') {
                          puVar10[local_b4] = 0;
                          goto LAB_00196ccb;
                        }
                        if (puVar9[(local_b4 + 1) - lVar2] != '\0') {
                          puVar10[local_b4] = *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
LAB_00197967:
                          while (iVar6 = local_b4 + 2, iVar6 < (int)(uVar1 - 2)) {
                            if (puVar9[iVar6] != '\0') goto LAB_001979b7;
LAB_00196c52:
                            while (local_b4 = iVar6, puVar9[local_b4 + 1] == '\0') {
                              puVar10[local_b4] = 0;
LAB_00196ccb:
                              iVar6 = local_b4 + 2;
                              if ((int)(uVar1 - 2) <= iVar6) {
                                if ((int)(uVar1 - 2) < iVar6) {
                                  if (puVar9[iVar6] == '\0') {
                                    puVar10[iVar6] = 0;
                                    return;
                                  }
                                }
                                else {
                                  if (puVar9[iVar6] == '\0') goto LAB_00198467;
                                  if (puVar9[(local_b4 + 3) - lVar2] != '\0') {
                                    if (puVar9[iVar6 - lVar2] != '\0') {
                                      puVar10[iVar6] =
                                           *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                                      return;
                                    }
                                    iVar11 = local_b4 + 1;
                                    local_b4 = iVar6;
                                    if (puVar9[iVar11 - lVar2] == '\0') {
                                      puVar10[iVar6] =
                                           *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                                      return;
                                    }
                                    goto LAB_00198538;
                                  }
                                }
                                if (puVar9[iVar6 - lVar2] != '\0') {
                                  puVar10[iVar6] =
                                       *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                                  return;
                                }
                                if (puVar9[(local_b4 + 1) - lVar2] != '\0') {
                                  puVar10[iVar6] =
                                       *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                                  return;
                                }
                                uVar7 = RemSP::NewLabel();
                                puVar10[iVar6] = uVar7;
                                return;
                              }
                              if (puVar9[iVar6] != '\0') {
                                if (puVar9[(local_b4 + 3) - lVar2] != '\0') {
                                  if (puVar9[iVar6 - lVar2] == '\0') {
                                    iVar11 = local_b4 + 1;
                                    local_b4 = iVar6;
                                    if (puVar9[iVar11 - lVar2] != '\0') goto LAB_00196d99;
                                    puVar10[iVar6] =
                                         *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                                  }
                                  else {
                                    puVar10[iVar6] =
                                         *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                                    local_b4 = iVar6;
                                  }
                                  goto LAB_00197c6c;
                                }
                                if (puVar9[local_b4 + 3] == '\0') {
                                  if (puVar9[iVar6 - lVar2] == '\0') {
                                    if (puVar9[(local_b4 + 1) - lVar2] == '\0') {
                                      uVar7 = RemSP::NewLabel();
                                      puVar10[iVar6] = uVar7;
                                      local_b4 = iVar6;
                                    }
                                    else {
                                      puVar10[iVar6] =
                                           *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                                      local_b4 = iVar6;
                                    }
                                  }
                                  else {
                                    puVar10[iVar6] =
                                         *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                                    local_b4 = iVar6;
                                  }
                                  goto LAB_001969f2;
                                }
                                if (puVar9[(local_b4 + 4) - lVar2] == '\0') {
                                  if (puVar9[iVar6 - lVar2] != '\0') {
                                    puVar10[iVar6] =
                                         *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                                    local_b4 = iVar6;
                                    goto LAB_0019739b;
                                  }
                                  if (puVar9[(local_b4 + 1) - lVar2] == '\0') {
                                    uVar7 = RemSP::NewLabel();
                                    puVar10[iVar6] = uVar7;
                                    local_b4 = iVar6;
                                  }
                                  else {
                                    puVar10[iVar6] =
                                         *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                                    local_b4 = iVar6;
                                  }
                                  goto LAB_0019712c;
                                }
                                if (puVar9[iVar6 - lVar2] != '\0') goto LAB_00196ae2;
                                if (puVar9[(local_b4 + 1) - lVar2] != '\0') goto LAB_00196ec0;
                                puVar10[iVar6] =
                                     *(uint *)((long)puVar10 + (long)(local_b4 + 4) * 4 + lVar4);
                                local_b4 = iVar6;
                                goto LAB_001976eb;
                              }
                            }
                            if (puVar9[(local_b4 + 1) - lVar2] == '\0') goto LAB_00196aa5;
                            puVar10[local_b4] =
                                 *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
                          }
                          if ((int)(uVar1 - 2) < iVar6) goto LAB_001982c9;
                          if (puVar9[iVar6] == '\0') goto LAB_00198467;
                          goto LAB_00198969;
                        }
                        if (puVar9[(local_b4 + 2) - lVar2] != '\0') {
                          puVar10[local_b4] =
                               *(uint *)((long)puVar10 + (long)(local_b4 + 2) * 4 + lVar4);
                          goto LAB_001976eb;
                        }
                        uVar7 = RemSP::NewLabel();
                        puVar10[local_b4] = uVar7;
                        goto LAB_0019712c;
                      }
                      if (puVar9[(local_b4 + 3) - lVar2] != '\0') {
                        uVar7 = RemSP::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4),
                                             puVar10[local_b4]);
                        puVar10[iVar6] = uVar7;
                        local_b4 = iVar6;
                        goto LAB_00197c6c;
                      }
                      if (puVar9[local_b4 + 3] == '\0') {
                        puVar10[iVar6] = puVar10[local_b4];
                        local_b4 = iVar6;
                        goto LAB_001969f2;
                      }
                      if (puVar9[(local_b4 + 4) - lVar2] != '\0') {
                        uVar7 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                      (long)(local_b4 + 4) * 4 + lVar4),
                                             puVar10[local_b4]);
                        puVar10[iVar6] = uVar7;
                        local_b4 = iVar6;
                        goto LAB_001976eb;
                      }
                      puVar10[iVar6] = puVar10[local_b4];
                      local_b4 = iVar6;
                    }
                  } while( true );
                }
                if (puVar9[(local_b4 + 3) + lVar3] == '\0') {
                  uVar7 = RemSP::Merge(*(uint *)((long)puVar10 + (long)(local_b4 + 4) * 4 + lVar4),
                                       puVar10[local_b4]);
                  puVar10[iVar6] = uVar7;
                  local_b4 = iVar6;
                }
                else {
                  puVar10[iVar6] = *(uint *)((long)puVar10 + (long)(local_b4 + 4) * 4 + lVar4);
                  local_b4 = iVar6;
                }
                goto LAB_001976eb;
              }
              if (puVar9[local_b4 + 3] == '\0') {
                puVar10[iVar6] = 0;
                local_b4 = iVar6;
                goto LAB_00196ccb;
              }
              if (puVar9[(local_b4 + 3) - lVar2] != '\0') {
                puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                local_b4 = iVar6;
                goto LAB_00197967;
              }
              if (puVar9[(local_b4 + 4) - lVar2] == '\0') {
                puVar10[iVar6] = *(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar4);
                local_b4 = iVar6;
                goto LAB_0019739b;
              }
LAB_00196ae2:
              local_b4 = iVar6;
              if (puVar9[(local_b4 + 1) + lVar3] == '\0') {
                uVar7 = RemSP::Merge(*(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4),
                                     *(uint *)((long)puVar10 + (long)(local_b4 + 2) * 4 + lVar4));
                puVar10[local_b4] = uVar7;
              }
              else {
                puVar10[local_b4] = *(uint *)((long)puVar10 + (long)(local_b4 + 2) * 4 + lVar4);
              }
            } while( true );
          }
          puVar10[iVar6] = puVar10[local_b4];
          local_b4 = iVar6;
        }
        goto LAB_001969f2;
      }
      if ((int)(uVar1 - 2) < iVar6) {
        local_b4 = iVar6;
        if (puVar9[iVar6] == '\0') {
          puVar10[iVar6] = 0;
          return;
        }
      }
      else {
        local_b4 = iVar6;
        if (puVar9[iVar6] == '\0') {
LAB_00198467:
          local_b4 = iVar6;
          if (puVar9[local_b4 + 1] == '\0') {
            puVar10[local_b4] = 0;
            return;
          }
        }
        if (puVar9[(local_b4 + 1) - lVar2] != '\0') {
          puVar10[local_b4] = *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
          return;
        }
      }
      if (puVar9[local_b4 - lVar2] == '\0') {
        uVar7 = RemSP::NewLabel();
        puVar10[local_b4] = uVar7;
      }
      else {
        puVar10[local_b4] = *(uint *)((long)puVar10 + (long)local_b4 * 4 + lVar4);
      }
    }
  }
  return;
LAB_00194345:
  img_row_3._4_4_ = iVar6;
  if (puVar9[(img_row_3._4_4_ + 1) - lVar2] != '\0') {
LAB_00194361:
    if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
      if (puVar9[img_row_3._4_4_ + lVar4] == '\0') {
        uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                             puVar10[img_row_3._4_4_ + -2]);
        puVar10[img_row_3._4_4_] = uVar8;
      }
      else {
        puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
      }
    }
    else {
      puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
    }
    goto LAB_00194f8e;
  }
  if (puVar9[img_row_3._4_4_ + 1] == '\0') {
    puVar10[img_row_3._4_4_] = puVar10[img_row_3._4_4_ + -2];
    goto LAB_0019529c;
  }
LAB_00194407:
  iVar6 = img_row_3._4_4_;
  if (puVar9[(img_row_3._4_4_ + 2) - lVar2] != '\0') goto LAB_00194423;
  puVar10[img_row_3._4_4_] = puVar10[img_row_3._4_4_ + -2];
  goto LAB_00194749;
LAB_00193e20:
  if (puVar9[img_row_3._4_4_ + 3] == '\0') {
    puVar10[iVar6] = puVar10[img_row_3._4_4_];
    img_row_3._4_4_ = iVar6;
LAB_0019529c:
    iVar6 = img_row_3._4_4_ + 2;
    if ((int)(uVar1 - 2) <= iVar6) {
      if ((int)(uVar1 - 2) < iVar6) {
        if (puVar9[iVar6] == '\0') goto LAB_001958eb;
        if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') goto LAB_00195672;
      }
      else {
        if (puVar9[iVar6] == '\0') {
          if (puVar9[iVar6 + lVar3] == '\0') goto LAB_00195d13;
          if (puVar9[img_row_3._4_4_ + 3] == '\0') goto LAB_001958fe;
        }
        if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') goto LAB_00195c9a;
        if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') {
          if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
            uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                                 puVar10[img_row_3._4_4_]);
            puVar10[iVar6] = uVar8;
          }
          else {
LAB_00196634:
            img_row_3._4_4_ = iVar6;
            iVar6 = img_row_3._4_4_;
            if (puVar9[(img_row_3._4_4_ + -1) + lVar4] != '\0') goto LAB_00196379;
            uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                                 puVar10[img_row_3._4_4_ + -2]);
            puVar10[img_row_3._4_4_] = uVar8;
          }
          goto LAB_00196918;
        }
      }
      if (puVar9[iVar6 - lVar2] != '\0') goto LAB_00195c0f;
      puVar10[iVar6] = puVar10[img_row_3._4_4_];
      goto LAB_00196918;
    }
    if (puVar9[iVar6] == '\0') {
      if (puVar9[iVar6 + lVar3] == '\0') goto LAB_0019307b;
      if (puVar9[img_row_3._4_4_ + 3] == '\0') goto LAB_001946f7;
      if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') goto LAB_0019302c;
      if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') {
        if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
          uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                               puVar10[img_row_3._4_4_]);
          puVar10[iVar6] = uVar8;
          img_row_3._4_4_ = iVar6;
        }
        else {
LAB_00194f2d:
          img_row_3._4_4_ = iVar6;
          iVar6 = img_row_3._4_4_;
          if (puVar9[(img_row_3._4_4_ + -1) + lVar4] != '\0') goto LAB_0019459c;
          uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                               puVar10[img_row_3._4_4_ + -2]);
          puVar10[img_row_3._4_4_] = uVar8;
        }
        goto LAB_00194304;
      }
    }
    else {
      if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') goto LAB_00192e79;
      if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') {
        if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
          uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                               puVar10[img_row_3._4_4_]);
          puVar10[iVar6] = uVar8;
          img_row_3._4_4_ = iVar6;
        }
        else {
LAB_00194bce:
          img_row_3._4_4_ = iVar6;
          if (puVar9[(img_row_3._4_4_ + -1) + lVar4] != '\0') goto LAB_00194361;
          uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                               puVar10[img_row_3._4_4_ + -2]);
          puVar10[img_row_3._4_4_] = uVar8;
        }
        goto LAB_00194f8e;
      }
      if (puVar9[img_row_3._4_4_ + 3] == '\0') {
        if (puVar9[iVar6 - lVar2] == '\0') {
          puVar10[iVar6] = puVar10[img_row_3._4_4_];
          img_row_3._4_4_ = iVar6;
          goto LAB_00194a96;
        }
        if (puVar9[img_row_3._4_4_ - lVar2] != '\0') goto LAB_00194e48;
        uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                             puVar10[img_row_3._4_4_]);
        puVar10[iVar6] = uVar8;
        img_row_3._4_4_ = iVar6;
LAB_00194b5d:
        while (iVar6 = img_row_3._4_4_ + 2, iVar6 < (int)(uVar1 - 2)) {
          if (puVar9[iVar6] == '\0') {
            if (puVar9[iVar6 + lVar3] != '\0') {
              if (puVar9[img_row_3._4_4_ + 3] == '\0') goto LAB_001946f7;
              if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') goto LAB_0019302c;
              if (puVar9[(img_row_3._4_4_ + 3) - lVar2] == '\0') goto LAB_00194c37;
              goto LAB_00194f2d;
            }
LAB_0019307b:
            while( true ) {
              while( true ) {
                img_row_3._4_4_ = iVar6;
                iVar6 = img_row_3._4_4_;
                if (puVar9[img_row_3._4_4_ + 1] != '\0') goto LAB_0019302c;
LAB_00193095:
                img_row_3._4_4_ = iVar6;
                if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') break;
                uVar8 = RemSP::NewLabel();
                puVar10[img_row_3._4_4_] = uVar8;
                iVar6 = img_row_3._4_4_ + 2;
                if ((int)(uVar1 - 2) <= iVar6) {
                  if ((int)(uVar1 - 2) < iVar6) {
                    img_row_3._4_4_ = iVar6;
                    if (puVar9[iVar6] == '\0') goto LAB_0019583f;
                    goto LAB_00195792;
                  }
                  if (puVar9[iVar6] != '\0') goto LAB_00195e83;
                  if (puVar9[iVar6 + lVar3] == '\0') goto LAB_00195d13;
                  if (puVar9[img_row_3._4_4_ + 3] != '\0') goto LAB_00195fe8;
                  puVar10[iVar6] = puVar10[img_row_3._4_4_];
                  goto LAB_00196918;
                }
                if (puVar9[iVar6] != '\0') goto LAB_0019345c;
                if (puVar9[iVar6 + lVar3] != '\0') {
                  if (puVar9[img_row_3._4_4_ + 3] != '\0') goto LAB_00193954;
                  puVar10[iVar6] = puVar10[img_row_3._4_4_];
                  img_row_3._4_4_ = iVar6;
                  goto LAB_0019464d;
                }
              }
              puVar10[img_row_3._4_4_] = 0;
              img_row_3._4_4_ = img_row_3._4_4_ + 2;
              if ((int)(uVar1 - 2) <= img_row_3._4_4_) {
                if ((int)(uVar1 - 2) < img_row_3._4_4_) {
                  if (puVar9[img_row_3._4_4_] == '\0') goto LAB_001956b1;
                  goto LAB_001956ff;
                }
                if (puVar9[img_row_3._4_4_] == '\0') goto LAB_00195cd4;
                goto LAB_00195d8b;
              }
              if (puVar9[img_row_3._4_4_] != '\0') break;
LAB_00193003:
              iVar6 = img_row_3._4_4_;
              if (puVar9[img_row_3._4_4_ + lVar3] != '\0') {
                if (puVar9[img_row_3._4_4_ + 1] != '\0') goto LAB_0019302c;
                uVar8 = RemSP::NewLabel();
                puVar10[img_row_3._4_4_] = uVar8;
                goto LAB_0019464d;
              }
            }
LAB_00193112:
            if (puVar9[(img_row_3._4_4_ + 1) - lVar2] != '\0') {
              if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
                if (puVar9[(img_row_3._4_4_ + -1) - lVar2] != '\0') goto LAB_00193170;
                puVar10[img_row_3._4_4_] =
                     *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
              }
              else {
                puVar10[img_row_3._4_4_] =
                     *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
              }
              goto LAB_00194f8e;
            }
            if (puVar9[img_row_3._4_4_ + 1] != '\0') {
              if (puVar9[(img_row_3._4_4_ + 2) - lVar2] != '\0') {
                if (puVar9[img_row_3._4_4_ - lVar2] != '\0') goto LAB_00192ef3;
                if (puVar9[(img_row_3._4_4_ + -1) - lVar2] == '\0') {
                  puVar10[img_row_3._4_4_] =
                       *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5);
                }
                else {
LAB_0019324f:
                  if (puVar9[(img_row_3._4_4_ + 1) + lVar4] == '\0') {
                    uVar8 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                  (long)(img_row_3._4_4_ + -2) * 4 + lVar5),
                                         *(uint *)((long)puVar10 +
                                                  (long)(img_row_3._4_4_ + 2) * 4 + lVar5));
                    puVar10[img_row_3._4_4_] = uVar8;
                  }
                  else if (puVar9[img_row_3._4_4_ + lVar4] == '\0') {
                    uVar8 = RemSP::Merge(*(uint *)((long)puVar10 +
                                                  (long)(img_row_3._4_4_ + -2) * 4 + lVar5),
                                         *(uint *)((long)puVar10 +
                                                  (long)(img_row_3._4_4_ + 2) * 4 + lVar5));
                    puVar10[img_row_3._4_4_] = uVar8;
                  }
                  else {
                    puVar10[img_row_3._4_4_] =
                         *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5);
                  }
                }
                goto LAB_001940b9;
              }
              if (puVar9[img_row_3._4_4_ - lVar2] != '\0') {
                puVar10[img_row_3._4_4_] =
                     *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
                goto LAB_00193d1f;
              }
              if (puVar9[(img_row_3._4_4_ + -1) - lVar2] == '\0') {
                uVar8 = RemSP::NewLabel();
                puVar10[img_row_3._4_4_] = uVar8;
              }
              else {
                puVar10[img_row_3._4_4_] =
                     *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + -2) * 4 + lVar5);
              }
              goto LAB_00193ac0;
            }
            if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
              if (puVar9[(img_row_3._4_4_ + -1) - lVar2] == '\0') {
                uVar8 = RemSP::NewLabel();
                puVar10[img_row_3._4_4_] = uVar8;
              }
              else {
                puVar10[img_row_3._4_4_] =
                     *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + -2) * 4 + lVar5);
              }
              goto LAB_00194a96;
            }
            puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
          }
          else {
            if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') goto LAB_00192e79;
            if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') goto LAB_00194bce;
            if (puVar9[img_row_3._4_4_ + 3] != '\0') {
LAB_00194c37:
              if (puVar9[(img_row_3._4_4_ + 4) - lVar2] == '\0') {
                if (puVar9[iVar6 - lVar2] != '\0') goto LAB_00194db2;
                puVar10[iVar6] = puVar10[img_row_3._4_4_];
                img_row_3._4_4_ = iVar6;
                goto LAB_00193ac0;
              }
              if (puVar9[(img_row_3._4_4_ + 3) + lVar4] != '\0') goto LAB_00194c69;
              if (puVar9[iVar6 - lVar2] != '\0') goto LAB_00194cd2;
              uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 4) * 4 + lVar5
                                            ),puVar10[img_row_3._4_4_]);
              puVar10[iVar6] = uVar8;
              img_row_3._4_4_ = iVar6;
              goto LAB_001940b9;
            }
            if (puVar9[iVar6 - lVar2] == '\0') {
              puVar10[iVar6] = puVar10[img_row_3._4_4_];
              img_row_3._4_4_ = iVar6;
LAB_00194a96:
              while( true ) {
                iVar6 = img_row_3._4_4_ + 2;
                if ((int)(uVar1 - 2) <= iVar6) {
                  if (iVar6 <= (int)(uVar1 - 2)) {
                    img_row_3._4_4_ = iVar6;
                    if (puVar9[iVar6] == '\0') goto LAB_001964a1;
                    goto LAB_001964ca;
                  }
                  if (puVar9[iVar6] == '\0') goto LAB_001958eb;
                  iVar11 = img_row_3._4_4_ + 1;
                  img_row_3._4_4_ = iVar6;
                  if (puVar9[iVar11 + lVar3] == '\0') goto LAB_00195672;
                  goto LAB_001957de;
                }
                if (puVar9[iVar6] == '\0') goto LAB_001946aa;
                if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') goto LAB_00192e79;
                if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') {
                  uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                                       puVar10[img_row_3._4_4_]);
                  puVar10[iVar6] = uVar8;
                  img_row_3._4_4_ = iVar6;
                  goto LAB_00194f8e;
                }
                iVar11 = img_row_3._4_4_ + 3;
                img_row_3._4_4_ = iVar6;
                if (puVar9[iVar11] != '\0') goto LAB_0019399e;
LAB_001938c0:
                if (puVar9[img_row_3._4_4_ - lVar2] != '\0') break;
                puVar10[img_row_3._4_4_] = puVar10[img_row_3._4_4_ + -2];
              }
              uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                                   puVar10[img_row_3._4_4_ + -2]);
              puVar10[img_row_3._4_4_] = uVar8;
            }
            else {
LAB_00194e48:
              img_row_3._4_4_ = iVar6;
              if (puVar9[(img_row_3._4_4_ + -1) + lVar4] == '\0') {
                uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                                     puVar10[img_row_3._4_4_ + -2]);
                puVar10[img_row_3._4_4_] = uVar8;
              }
              else {
                puVar10[img_row_3._4_4_] =
                     *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
              }
            }
          }
        }
        if ((int)(uVar1 - 2) < iVar6) {
          if (puVar9[iVar6] == '\0') goto LAB_001958eb;
          if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') goto LAB_00195672;
        }
        else {
          if (puVar9[iVar6] == '\0') {
            if (puVar9[iVar6 + lVar3] == '\0') goto LAB_00195d13;
            if (puVar9[img_row_3._4_4_ + 3] == '\0') goto LAB_001958fe;
          }
          if (puVar9[(img_row_3._4_4_ + 1) + lVar3] == '\0') goto LAB_00195c9a;
          if (puVar9[(img_row_3._4_4_ + 3) - lVar2] != '\0') goto LAB_00196634;
        }
        if (puVar9[iVar6 - lVar2] != '\0') goto LAB_001959d5;
        puVar10[iVar6] = puVar10[img_row_3._4_4_];
        goto LAB_00196918;
      }
    }
    if (puVar9[(img_row_3._4_4_ + 4) - lVar2] == '\0') {
      if (puVar9[iVar6 - lVar2] == '\0') {
        puVar10[iVar6] = puVar10[img_row_3._4_4_];
        img_row_3._4_4_ = iVar6;
        goto LAB_00193ac0;
      }
      if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
        uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                             puVar10[img_row_3._4_4_]);
        puVar10[iVar6] = uVar8;
        img_row_3._4_4_ = iVar6;
      }
      else {
LAB_00194db2:
        img_row_3._4_4_ = iVar6;
        if (puVar9[(img_row_3._4_4_ + -1) + lVar4] == '\0') {
          uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                               puVar10[img_row_3._4_4_ + -2]);
          puVar10[img_row_3._4_4_] = uVar8;
        }
        else {
          puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
        }
      }
      goto LAB_00193d1f;
    }
    if (puVar9[(img_row_3._4_4_ + 3) + lVar4] == '\0') {
      if (puVar9[iVar6 - lVar2] == '\0') {
        uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 4) * 4 + lVar5),
                             puVar10[img_row_3._4_4_]);
        puVar10[iVar6] = uVar8;
        img_row_3._4_4_ = iVar6;
      }
      else if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
        uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)iVar6 * 4 + lVar5),
                             *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 4) * 4 + lVar5));
        uVar8 = RemSP::Merge(uVar8,puVar10[img_row_3._4_4_]);
        puVar10[iVar6] = uVar8;
        img_row_3._4_4_ = iVar6;
      }
      else {
LAB_00194cd2:
        img_row_3._4_4_ = iVar6;
        if (puVar9[(img_row_3._4_4_ + -1) + lVar4] == '\0') {
          uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                               *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5));
          uVar8 = RemSP::Merge(uVar8,puVar10[img_row_3._4_4_ + -2]);
          puVar10[img_row_3._4_4_] = uVar8;
        }
        else {
          uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5),
                               puVar10[img_row_3._4_4_ + -2]);
          puVar10[img_row_3._4_4_] = uVar8;
        }
      }
    }
    else if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
      uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 4) * 4 + lVar5),
                           puVar10[img_row_3._4_4_]);
      puVar10[iVar6] = uVar8;
      img_row_3._4_4_ = iVar6;
    }
    else {
LAB_00194c69:
      img_row_3._4_4_ = iVar6;
      if (puVar9[(img_row_3._4_4_ + -1) + lVar4] != '\0') goto LAB_0019443f;
      uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5),
                           puVar10[img_row_3._4_4_ + -2]);
      puVar10[img_row_3._4_4_] = uVar8;
    }
    goto LAB_001940b9;
  }
LAB_00193e3c:
  if (puVar9[(img_row_3._4_4_ + 4) - lVar2] == '\0') {
    puVar10[iVar6] = puVar10[img_row_3._4_4_];
    img_row_3._4_4_ = iVar6;
    goto LAB_00194749;
  }
  if (puVar9[(img_row_3._4_4_ + 3) + lVar4] == '\0') {
    uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 4) * 4 + lVar5),
                         puVar10[img_row_3._4_4_]);
    puVar10[iVar6] = uVar8;
    img_row_3._4_4_ = iVar6;
  }
  else {
    if (puVar9[iVar6 + lVar4] != '\0') goto LAB_00193e83;
    uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 4) * 4 + lVar5),
                         puVar10[img_row_3._4_4_]);
    puVar10[iVar6] = uVar8;
    img_row_3._4_4_ = iVar6;
  }
  goto LAB_001940b9;
LAB_0019302c:
  img_row_3._4_4_ = iVar6;
  if (puVar9[(img_row_3._4_4_ + 1) - lVar2] != '\0') {
    puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
    goto LAB_00194304;
  }
LAB_00192ec6:
  if (puVar9[(img_row_3._4_4_ + 2) - lVar2] != '\0') {
    if (puVar9[img_row_3._4_4_ - lVar2] != '\0') goto LAB_00192ef3;
    puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5);
    goto LAB_001940b9;
  }
  if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
    uVar8 = RemSP::NewLabel();
    puVar10[img_row_3._4_4_] = uVar8;
    goto LAB_00193ac0;
  }
  puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5);
  goto LAB_00193d1f;
LAB_0019345c:
  img_row_3._4_4_ = iVar6;
  if (puVar9[(img_row_3._4_4_ + 1) - lVar2] != '\0') {
    if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
      if (puVar9[(img_row_3._4_4_ + -1) - lVar2] == '\0') {
        uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                             puVar10[img_row_3._4_4_ + -2]);
        puVar10[img_row_3._4_4_] = uVar8;
      }
      else if (puVar9[img_row_3._4_4_ + lVar4] == '\0') {
        uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + -2) * 4 + lVar5),
                             *(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5));
        uVar8 = RemSP::Merge(uVar8,puVar10[img_row_3._4_4_ + -2]);
        puVar10[img_row_3._4_4_] = uVar8;
      }
      else {
        uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                             puVar10[img_row_3._4_4_ + -2]);
        puVar10[img_row_3._4_4_] = uVar8;
      }
    }
    else {
      uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                           puVar10[img_row_3._4_4_ + -2]);
      puVar10[img_row_3._4_4_] = uVar8;
    }
    goto LAB_00194f8e;
  }
  if (puVar9[img_row_3._4_4_ + 1] != '\0') {
    if (puVar9[(img_row_3._4_4_ + 2) - lVar2] == '\0') {
      if (puVar9[(img_row_3._4_4_ + -1) - lVar2] == '\0') goto LAB_0019380e;
      uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + -2) * 4 + lVar5),
                           puVar10[img_row_3._4_4_ + -2]);
      puVar10[img_row_3._4_4_] = uVar8;
      goto LAB_00194749;
    }
    if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
      if (puVar9[(img_row_3._4_4_ + -1) - lVar2] == '\0') {
        uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5),
                             puVar10[img_row_3._4_4_ + -2]);
        puVar10[img_row_3._4_4_] = uVar8;
      }
      else if (puVar9[(img_row_3._4_4_ + 1) + lVar4] == '\0') {
        uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + -2) * 4 + lVar5),
                             *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5));
        uVar8 = RemSP::Merge(uVar8,puVar10[img_row_3._4_4_ + -2]);
        puVar10[img_row_3._4_4_] = uVar8;
      }
      else if (puVar9[img_row_3._4_4_ + lVar4] == '\0') {
        uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + -2) * 4 + lVar5),
                             *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5));
        uVar8 = RemSP::Merge(uVar8,puVar10[img_row_3._4_4_ + -2]);
        puVar10[img_row_3._4_4_] = uVar8;
      }
      else {
        uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5),
                             puVar10[img_row_3._4_4_ + -2]);
        puVar10[img_row_3._4_4_] = uVar8;
      }
    }
    else if (puVar9[(img_row_3._4_4_ + 1) + lVar4] == '\0') {
      uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)img_row_3._4_4_ * 4 + lVar5),
                           *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5));
      uVar8 = RemSP::Merge(uVar8,puVar10[img_row_3._4_4_ + -2]);
      puVar10[img_row_3._4_4_] = uVar8;
    }
    else {
      uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5),
                           puVar10[img_row_3._4_4_ + -2]);
      puVar10[img_row_3._4_4_] = uVar8;
    }
    goto LAB_001940b9;
  }
  if (puVar9[(img_row_3._4_4_ + -1) - lVar2] == '\0') goto LAB_001938c0;
  uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + -2) * 4 + lVar5),
                       puVar10[img_row_3._4_4_ + -2]);
  puVar10[img_row_3._4_4_] = uVar8;
  goto LAB_0019529c;
LAB_00194423:
  img_row_3._4_4_ = iVar6;
  if (puVar9[(img_row_3._4_4_ + 1) + lVar4] == '\0') {
    uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5),
                         puVar10[img_row_3._4_4_ + -2]);
    puVar10[img_row_3._4_4_] = uVar8;
  }
  else {
LAB_0019443f:
    if (puVar9[img_row_3._4_4_ - lVar2] == '\0') {
      if (puVar9[img_row_3._4_4_ + lVar4] == '\0') {
        uVar8 = RemSP::Merge(*(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5),
                             puVar10[img_row_3._4_4_ + -2]);
        puVar10[img_row_3._4_4_] = uVar8;
      }
      else {
        puVar10[img_row_3._4_4_] =
             *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5);
      }
    }
    else {
      puVar10[img_row_3._4_4_] = *(uint *)((long)puVar10 + (long)(img_row_3._4_4_ + 2) * 4 + lVar5);
    }
  }
  goto LAB_001940b9;
}

Assistant:

void FirstScan()
	{
		const int h = img_.rows;
		const int w = img_.cols;

		e_rows = h & 0xfffffffe;
		o_rows = h % 2 == 1;
		e_cols = w & 0xfffffffe;
		o_cols = w % 2 == 1;

		LabelsSolver::Setup(); // Labels solver initialization

							   // We work with 2x2 blocks
							   // +-+-+-+
							   // |P|Q|R|
							   // +-+-+-+
							   // |S|X|
							   // +-+-+

							   // The pixels are named as follows
							   // +---+---+---+
							   // |a b|c d|e f|
							   // |g h|i j|k l|
							   // +---+---+---+
							   // |m n|o p|
							   // |q r|s t|
							   // +---+---+

							   // Pixels a, f, l, q are not needed, since we need to understand the
							   // the connectivity between these blocks and those pixels only matter
							   // when considering the outer connectivities

							   // A bunch of defines used to check if the pixels are foreground,
							   // without going outside the image limits.

							   // First scan

		// Define Conditions and Actions
		{
#define CONDITION_B img_row_prev_prev[c-1]>0
#define CONDITION_C img_row_prev_prev[c]>0
#define CONDITION_D img_row_prev_prev[c+1]>0
#define CONDITION_E img_row_prev_prev[c+2]>0

#define CONDITION_G img_row_prev[c-2]>0
#define CONDITION_H img_row_prev[c-1]>0
#define CONDITION_I img_row_prev[c]>0
#define CONDITION_J img_row_prev[c+1]>0
#define CONDITION_K img_row_prev[c+2]>0

#define CONDITION_M img_row[c-2]>0
#define CONDITION_N img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P img_row[c+1]>0

#define CONDITION_R img_row_fol[c-1]>0
#define CONDITION_S img_row_fol[c]>0
#define CONDITION_T img_row_fol[c+1]>0

			// Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; 
							   // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); 
							   //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2];
							   // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c];
							   // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2];
							   // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; 
							   // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]);
							   //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]);
							   // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]);
							   // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]);
							   // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]);
							   // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]);
							   // Action 13: Merge labels of block P, Q and R
#define ACTION_13 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row_prev_prev[c + 2]);
							   // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]);
							   //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
							   //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
		}

		if (h == 1) {
			// Single line
			// int r = 0;
			const unsigned char* const img_row = img_.ptr<unsigned char>(0);
			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
			int c = -2;
#include "labeling_bolelli_2019_forest_sl.inc.h"
		}
		else {
			// More than one line

			// First couple of lines
			{
				// int r = 0;
				const unsigned char* const img_row = img_.ptr<unsigned char>(0);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
				int c = -2;

#include "labeling_bolelli_2019_forest_fl.inc.h"
			}

			// Every other line but the last one if image has an odd number of rows
			for (int r = 2; r < e_rows; r += 2) {
				// Get rows pointer
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

				int c = -2;
				goto tree_0;

#include "labeling_bolelli_2019_forest.inc.h"
			}

			// Last line (in case the rows are odd)
			if (o_rows)
			{
				int r = h - 1;
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
				int c = -2;
#include "labeling_bolelli_2019_forest_ll.inc.h"
			}
		}


		// Undef Conditions and Actions
		{
#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
		}
	}